

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O1

void __thiscall Patch::rotate_node_left(Patch *this,Node *pivot,Node *root,Node *root_parent)

{
  Point PVar1;
  Point local_20;
  
  if (root_parent != (Node *)0x0) {
    this = (Patch *)(&root_parent->left + (root_parent->left != root));
  }
  this->root = pivot;
  root->right = pivot->left;
  pivot->left = root;
  local_20 = Point::traverse(&root->old_distance_from_left_ancestor,&root->old_extent);
  PVar1 = Point::traverse(&local_20,&pivot->old_distance_from_left_ancestor);
  pivot->old_distance_from_left_ancestor = PVar1;
  local_20 = Point::traverse(&root->new_distance_from_left_ancestor,&root->new_extent);
  PVar1 = Point::traverse(&local_20,&pivot->new_distance_from_left_ancestor);
  pivot->new_distance_from_left_ancestor = PVar1;
  Node::compute_subtree_text_sizes(root);
  Node::compute_subtree_text_sizes(pivot);
  return;
}

Assistant:

void Patch::rotate_node_left(Node *pivot, Node *root, Node *root_parent) {
  if (root_parent) {
    if (root_parent->left == root) {
      root_parent->left = pivot;
    } else {
      root_parent->right = pivot;
    }
  } else {
    this->root = pivot;
  }

  root->right = pivot->left;
  pivot->left = root;

  pivot->old_distance_from_left_ancestor =
      root->old_distance_from_left_ancestor.traverse(root->old_extent)
          .traverse(pivot->old_distance_from_left_ancestor);
  pivot->new_distance_from_left_ancestor =
      root->new_distance_from_left_ancestor.traverse(root->new_extent)
          .traverse(pivot->new_distance_from_left_ancestor);

  root->compute_subtree_text_sizes();
  pivot->compute_subtree_text_sizes();
}